

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_ValidateAndCanonicalizeTimeZone
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  CallFlags e;
  int iVar6;
  ScriptContext *pSVar7;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  UEnumeration *pUVar10;
  LPCSTR pCVar11;
  char16_t *string1;
  undefined4 extraout_var;
  size_t sVar12;
  JavascriptLibrary *this_00;
  size_t len;
  UChar *cur;
  int curLen;
  int a;
  UChar match [100];
  charcount_t matchLen;
  int availableLength;
  ScopedUEnumeration available;
  UErrorCode status;
  JavascriptString *tz;
  ScriptContext *scriptContext;
  uint argCount;
  undefined1 local_48 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar7 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar7);
  pSVar7 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar7,(PVOID)0x0);
  iVar5 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar5);
  args.Values = (Type)callInfo;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  Arguments::Arguments((Arguments *)local_48,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  uVar2 = (ulong)local_48 & 0xffffff;
  pSVar7 = RecyclableObject::GetScriptContext(function);
  if (uVar2 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (((local_48._0_4_ & 0xffffff) != 2) ||
     (bVar3 = VarIs<Js::JavascriptString>(*(Var *)((long)args.Info + 8)), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb33,
                                "((args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pJVar9 = VarTo<Js::JavascriptString>(*(Var *)((long)args.Info + 8));
  available.object._4_4_ = U_ZERO_ERROR;
  pUVar10 = (UEnumeration *)
            ucal_openTimeZoneIDEnumeration_70(0,0,0,(undefined1 *)((long)&available.object + 4));
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::ScopedICUObject
            ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xffffffffffffff88,pUVar10);
  pUVar10 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                      ((ScopedICUObject *)&stack0xffffffffffffff88);
  iVar5 = uenum_count_70(pUVar10);
  if (available.object._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
    Throw::OutOfMemory();
  }
  UVar4 = U_FAILURE(available.object._4_4_);
  if ((UVar4 == '\0') && (available.object._4_4_ != U_STRING_NOT_TERMINATED_WARNING)) {
    if ((iVar5 < 1) && (iVar5 < 1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb4b,"(availableLength > 0)","availableLength > 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    pCVar11 = (LPCSTR)u_errorName_70(available.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb4b,"(false)",pCVar11);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  match[0x60] = L'\0';
  match[0x61] = L'\0';
  memset(&curLen,0,200);
  cur._4_4_ = 0;
  do {
    if (iVar5 <= cur._4_4_) {
LAB_0109d2a6:
      if (match._192_4_ == 0) {
        this_00 = ScriptContext::GetLibrary(pSVar7);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      }
      else {
        callInfo_local =
             (CallInfo)JavascriptString::NewCopyBuffer((char16 *)&curLen,match._192_4_,pSVar7);
      }
      PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::
      ~ScopedICUObject((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xffffffffffffff88)
      ;
      return (Var)callInfo_local;
    }
    cur._0_4_ = -1;
    pUVar10 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                        ((ScopedICUObject *)&stack0xffffffffffffff88);
    string1 = (char16_t *)uenum_unext_70(pUVar10,&cur,(undefined1 *)((long)&available.object + 4));
    if (available.object._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar4 = U_FAILURE(available.object._4_4_);
    if ((UVar4 != '\0') || (available.object._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      pCVar11 = (LPCSTR)u_errorName_70(available.object._4_4_);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb53,"(false)",pCVar11);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if ((int)cur == 0) {
      Throw::OutOfMemory();
    }
    if ((int)cur < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb5c,"(curLen > 0)","curLen > 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    iVar6 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    iVar6 = _wcsicmp(string1,(char16_t *)CONCAT44(extraout_var,iVar6));
    if (iVar6 == 0) {
      ucal_getCanonicalTimeZoneID_70
                (string1,(int)cur,&curLen,100,0,(undefined1 *)((long)&available.object + 4));
      if (available.object._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
        Throw::OutOfMemory();
      }
      UVar4 = U_FAILURE(available.object._4_4_);
      if ((UVar4 != '\0') || (available.object._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        pCVar11 = (LPCSTR)u_errorName_70(available.object._4_4_);
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xb60,"(false)",pCVar11);
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      sVar12 = PAL_wcslen((char16_t *)&curLen);
      if (0x7ffffffd < sVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xb62,"(len < MaxCharCount)",
                                    "Returned canonicalized timezone is far too long");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      match._192_4_ = (undefined4)sVar12;
      goto LAB_0109d2a6;
    }
    cur._4_4_ = cur._4_4_ + 1;
  } while( true );
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_ValidateAndCanonicalizeTimeZone(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1]));

        JavascriptString *tz = VarTo<JavascriptString>(args.Values[1]);

#ifdef INTL_WINGLOB
        AutoHSTRING canonicalizedTimeZone;
        boolean isValidTimeZone = GetWindowsGlobalizationAdapter(scriptContext)->ValidateAndCanonicalizeTimeZone(scriptContext, tz->GetSz(), &canonicalizedTimeZone);
        if (isValidTimeZone)
        {
            DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
            PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*canonicalizedTimeZone, NULL);
            return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
        }
        else
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
#else
        UErrorCode status = U_ZERO_ERROR;

        // TODO(jahorto): Is this the list of timeZones that we want? How is this different from
        // the other two enum values or ucal_openTimeZones?
        ScopedUEnumeration available(ucal_openTimeZoneIDEnumeration(UCAL_ZONE_TYPE_ANY, nullptr, nullptr, &status));
        int availableLength = uenum_count(available, &status);
        ICU_ASSERT(status, availableLength > 0);

        charcount_t matchLen = 0;
        UChar match[100] = { 0 };
        for (int a = 0; a < availableLength; ++a)
        {
            int curLen = -1;
            const UChar *cur = uenum_unext(available, &curLen, &status);
            ICU_ASSERT(status, true);
            if (curLen == 0)
            {
                // OS#17175014: in rare cases, ICU will return U_ZERO_ERROR and a valid `cur` string but a length of 0
                // This only happens in an OOM during uenum_(u)next
                // Tracked by ICU: http://bugs.icu-project.org/trac/ticket/13739
                Throw::OutOfMemory();
            }

            AssertOrFailFast(curLen > 0);
            if (_wcsicmp(reinterpret_cast<const char16 *>(cur), tz->GetSz()) == 0)
            {
                ucal_getCanonicalTimeZoneID(cur, curLen, match, _countof(match), nullptr, &status);
                ICU_ASSERT(status, true);
                size_t len = wcslen(reinterpret_cast<const char16 *>(match));
                AssertMsg(len < MaxCharCount, "Returned canonicalized timezone is far too long");
                matchLen = static_cast<charcount_t>(len);
                break;
            }
        }

        if (matchLen == 0)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return JavascriptString::NewCopyBuffer(reinterpret_cast<const char16 *>(match), matchLen, scriptContext);
#endif
    }